

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

intptr_t fio_unix_socket(char *address,uint8_t server)

{
  int fd_00;
  int iVar1;
  size_t sVar2;
  int *piVar3;
  int fd;
  size_t addr_len;
  sockaddr_un addr;
  uint8_t server_local;
  char *address_local;
  
  addr.sun_path[0x65] = server;
  unique0x10000222 = address;
  memset(&addr_len,0,0x6e);
  sVar2 = strlen(stack0xffffffffffffffe8);
  if (sVar2 < 0x6c) {
    addr_len._0_2_ = 1;
    memcpy((void *)((long)&addr_len + 2),stack0xffffffffffffffe8,sVar2 + 1);
    fd_00 = socket(1,1,0);
    if (fd_00 == -1) {
      address_local = (char *)0xffffffffffffffff;
    }
    else {
      iVar1 = fio_set_non_block(fd_00);
      if (iVar1 == -1) {
        close(fd_00);
        address_local = (char *)0xffffffffffffffff;
      }
      else {
        if (addr.sun_path[0x65] == '\0') {
          iVar1 = connect(fd_00,(sockaddr *)&addr_len,0x6e);
          if ((iVar1 == -1) && (piVar3 = __errno_location(), *piVar3 != 0x73)) {
            close(fd_00);
            return -1;
          }
        }
        else {
          unlink((char *)((long)&addr_len + 2));
          iVar1 = bind(fd_00,(sockaddr *)&addr_len,0x6e);
          if (iVar1 == -1) {
            close(fd_00);
            return -1;
          }
          iVar1 = listen(fd_00,0x1000);
          if (iVar1 < 0) {
            close(fd_00);
            return -1;
          }
          fchmod(fd_00,0x1ff);
        }
        fio_lock((fio_lock_i *)((long)fio_data + (long)fd_00 * 0xa8 + 0x6c));
        fio_clear_fd((long)fd_00,'\x01');
        fio_unlock((fio_lock_i *)((long)fio_data + (long)fd_00 * 0xa8 + 0x6c));
        if (sVar2 < 0x30) {
          memcpy((void *)((long)fio_data + (long)fd_00 * 0xa8 + 0x72),stack0xffffffffffffffe8,
                 sVar2 + 1);
          *(char *)((long)fio_data + (long)fd_00 * 0xa8 + 0x71) = (char)sVar2;
        }
        address_local =
             (char *)(long)CONCAT41(fd_00,*(undefined1 *)
                                           ((long)fio_data + (long)fd_00 * 0xa8 + 0x6d));
      }
    }
  }
  else {
    if (1 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR("ERROR: (fio_unix_socket) address too long (%zu bytes > %zu bytes).",sVar2,0x6b
                    );
    }
    piVar3 = __errno_location();
    *piVar3 = 0x24;
    address_local = (char *)0xffffffffffffffff;
  }
  return (intptr_t)address_local;
}

Assistant:

static intptr_t fio_unix_socket(const char *address, uint8_t server) {
  /* Unix socket */
  struct sockaddr_un addr = {0};
  size_t addr_len = strlen(address);
  if (addr_len >= sizeof(addr.sun_path)) {
    FIO_LOG_ERROR("(fio_unix_socket) address too long (%zu bytes > %zu bytes).",
                  addr_len, sizeof(addr.sun_path) - 1);
    errno = ENAMETOOLONG;
    return -1;
  }
  addr.sun_family = AF_UNIX;
  memcpy(addr.sun_path, address, addr_len + 1); /* copy the NUL byte. */
#if defined(__APPLE__)
  addr.sun_len = addr_len;
#endif
  // get the file descriptor
  int fd = socket(AF_UNIX, SOCK_STREAM, 0);
  if (fd == -1) {
    return -1;
  }
  if (fio_set_non_block(fd) == -1) {
    close(fd);
    return -1;
  }
  if (server) {
    unlink(addr.sun_path);
    if (bind(fd, (struct sockaddr *)&addr, sizeof(addr)) == -1) {
      // perror("couldn't bind unix socket");
      close(fd);
      return -1;
    }
    if (listen(fd, SOMAXCONN) < 0) {
      // perror("couldn't start listening to unix socket");
      close(fd);
      return -1;
    }
    /* chmod for foriegn connections */
    fchmod(fd, 0777);
  } else {
    if (connect(fd, (struct sockaddr *)&addr, sizeof(addr)) == -1 &&
        errno != EINPROGRESS) {
      close(fd);
      return -1;
    }
  }
  fio_lock(&fd_data(fd).protocol_lock);
  fio_clear_fd(fd, 1);
  fio_unlock(&fd_data(fd).protocol_lock);
  if (addr_len < sizeof(fd_data(fd).addr)) {
    memcpy(fd_data(fd).addr, address, addr_len + 1); /* copy the NUL byte. */
    fd_data(fd).addr_len = addr_len;
  }
  return fd2uuid(fd);
}